

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O2

void * QArrayData::allocate2(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  AllocationResult AVar1;
  
  AVar1 = allocateHelper(2,0x10,capacity,option);
  *dptr = AVar1.header;
  return AVar1.data;
}

Assistant:

void *QArrayData::allocate2(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(2, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}